

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask
               (int num_codes,uint8_t *code_length_bitdepth,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  size_t l;
  size_t i;
  size_t codes_to_store;
  size_t skip_some;
  uint8_t *storage_local;
  size_t *storage_ix_local;
  uint8_t *code_length_bitdepth_local;
  int num_codes_local;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  
  codes_to_store = 0;
  i = 0x12;
  if (1 < num_codes) {
    while ((i != 0 &&
           (code_length_bitdepth[*(byte *)((long)kStaticDistanceCodeBits + i + 0x7f)] == '\0'))) {
      i = i - 1;
    }
  }
  if (((code_length_bitdepth[1] == '\0') && (code_length_bitdepth[2] == '\0')) &&
     (codes_to_store = 2, code_length_bitdepth[3] == '\0')) {
    codes_to_store = 3;
  }
  *(size_t *)(storage + (*storage_ix >> 3)) =
       codes_to_store << ((byte)*storage_ix & 7) |
       (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
  *storage_ix = *storage_ix + 2;
  for (l = codes_to_store; l < i; l = l + 1) {
    bVar1 = "\x02\x04\x03\x02\x02\x04"[code_length_bitdepth["\x01\x02\x03\x04"[l]]];
    *(ulong *)(storage + (*storage_ix >> 3)) =
         (ulong)""[code_length_bitdepth["\x01\x02\x03\x04"[l]]] << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = (ulong)bVar1 + *storage_ix;
  }
  return;
}

Assistant:

static void BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask(
    const int num_codes, const uint8_t* code_length_bitdepth,
    size_t* storage_ix, uint8_t* storage) {
  static const uint8_t kStorageOrder[BROTLI_CODE_LENGTH_CODES] = {
    1, 2, 3, 4, 0, 5, 17, 6, 16, 7, 8, 9, 10, 11, 12, 13, 14, 15
  };
  /* The bit lengths of the Huffman code over the code length alphabet
     are compressed with the following static Huffman code:
       Symbol   Code
       ------   ----
       0          00
       1        1110
       2         110
       3          01
       4          10
       5        1111 */
  static const uint8_t kHuffmanBitLengthHuffmanCodeSymbols[6] = {
     0, 7, 3, 2, 1, 15
  };
  static const uint8_t kHuffmanBitLengthHuffmanCodeBitLengths[6] = {
    2, 4, 3, 2, 2, 4
  };

  size_t skip_some = 0;  /* skips none. */

  /* Throw away trailing zeros: */
  size_t codes_to_store = BROTLI_CODE_LENGTH_CODES;
  if (num_codes > 1) {
    for (; codes_to_store > 0; --codes_to_store) {
      if (code_length_bitdepth[kStorageOrder[codes_to_store - 1]] != 0) {
        break;
      }
    }
  }
  if (code_length_bitdepth[kStorageOrder[0]] == 0 &&
      code_length_bitdepth[kStorageOrder[1]] == 0) {
    skip_some = 2;  /* skips two. */
    if (code_length_bitdepth[kStorageOrder[2]] == 0) {
      skip_some = 3;  /* skips three. */
    }
  }
  BrotliWriteBits(2, skip_some, storage_ix, storage);
  {
    size_t i;
    for (i = skip_some; i < codes_to_store; ++i) {
      size_t l = code_length_bitdepth[kStorageOrder[i]];
      BrotliWriteBits(kHuffmanBitLengthHuffmanCodeBitLengths[l],
          kHuffmanBitLengthHuffmanCodeSymbols[l], storage_ix, storage);
    }
  }
}